

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

XercesAttGroupInfo * __thiscall
xercesc_4_0::TraverseSchema::traverseAttributeGroupDecl
          (TraverseSchema *this,DOMElement *elem,ComplexTypeInfo *typeInfo,bool topLevel)

{
  XMLBuffer *this_00;
  short sVar1;
  short sVar2;
  SchemaInfo *pSVar3;
  XercesAttGroupInfo *pXVar4;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *this_01;
  XMLStringPool *pXVar5;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar6;
  uint uVar7;
  int iVar8;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  DOMElement *pDVar11;
  DOMNode *node;
  XSAnnotation *annotation;
  XercesAttGroupInfo *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SchemaAttDef *pSVar13;
  undefined4 extraout_var_02;
  char16_t *pcVar14;
  ulong uVar15;
  SchemaAttDef *pSVar16;
  short *psVar17;
  XMLSize_t XVar18;
  XMLCh XVar19;
  XMLSize_t getAt;
  RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *pRVar20;
  bool bVar21;
  bool bVar22;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  short *psVar12;
  
  pSVar3 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar3;
  pXVar9 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  pXVar10 = getElementAttValue(this,elem,L"ref",QName);
  if (pXVar9 == (XMLCh *)0x0) {
    bVar21 = false;
  }
  else {
    bVar21 = *pXVar9 != L'\0';
  }
  if (pXVar10 == (XMLCh *)0x0) {
    bVar22 = true;
  }
  else {
    bVar22 = *pXVar10 == L'\0';
  }
  if (topLevel && !bVar21) {
    this_02 = (XercesAttGroupInfo *)0x0;
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x55,L"attributeGroup",
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    goto LAB_00329ee4;
  }
  if (bVar21 || bVar22 != true) {
    GeneralAttributeCheck::checkAttributes
              (&this->fAttributeCheck,elem,topLevel ^ 9,this,topLevel,this->fNonXSAttList);
    if (topLevel) {
      XVar18 = 0;
      if (pXVar9 != (XMLCh *)0x0) {
        do {
          psVar12 = (short *)((long)pXVar9 + XVar18);
          XVar18 = XVar18 + 2;
        } while (*psVar12 != 0);
        XVar18 = ((long)XVar18 >> 1) - 1;
      }
      bVar21 = XMLChar1_0::isValidNCName(pXVar9,XVar18);
      if (bVar21) {
        pDVar11 = XUtil::getFirstChildElement(&elem->super_DOMNode);
        node = &checkContent(this,elem,pDVar11,true,true)->super_DOMNode;
        annotation = this->fAnnotation;
        if ((annotation == (XSAnnotation *)0x0 & this->fScanner->fGenerateSyntheticAnnotations) == 1
           ) {
          if (this->fNonXSAttList->fCurCount == 0) {
            annotation = (XSAnnotation *)0x0;
          }
          else {
            annotation = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
            this->fAnnotation = annotation;
          }
        }
        pXVar4 = this->fCurrentAttGroupInfo;
        this_02 = (XercesAttGroupInfo *)XMemory::operator_new(0x38,this->fGrammarPoolMemoryManager);
        uVar7 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                          (this->fStringPool,pXVar9);
        XercesAttGroupInfo::XercesAttGroupInfo
                  (this_02,uVar7,this->fTargetNSURI,this->fGrammarPoolMemoryManager);
        this_01 = this->fDeclStack;
        ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ensureExtraCapacity(this_01,1);
        XVar18 = this_01->fCurCount;
        this_01->fCurCount = XVar18 + 1;
        this_01->fElemList[XVar18] = elem;
        this->fCurrentAttGroupInfo = this_02;
        for (; node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
          iVar8 = (*node->_vptr_DOMNode[0x18])(node);
          psVar12 = (short *)CONCAT44(extraout_var,iVar8);
          if (psVar12 == &SchemaSymbols::fgELT_ATTRIBUTE) {
LAB_0032a068:
            traverseAttributeDecl(this,(DOMElement *)node,typeInfo,false);
          }
          else {
            psVar17 = &SchemaSymbols::fgELT_ATTRIBUTE;
            if (psVar12 == (short *)0x0) {
LAB_0032a01f:
              if (*psVar17 == 0) goto LAB_0032a068;
            }
            else {
              psVar17 = &SchemaSymbols::fgELT_ATTRIBUTE;
              do {
                sVar1 = *psVar12;
                if (sVar1 == 0) goto LAB_0032a01f;
                psVar12 = psVar12 + 1;
                sVar2 = *psVar17;
                psVar17 = psVar17 + 1;
              } while (sVar1 == sVar2);
            }
            iVar8 = (*node->_vptr_DOMNode[0x18])(node);
            psVar12 = (short *)CONCAT44(extraout_var_00,iVar8);
            if (psVar12 != &SchemaSymbols::fgELT_ATTRIBUTEGROUP) {
              psVar17 = &SchemaSymbols::fgELT_ATTRIBUTEGROUP;
              if (psVar12 != (short *)0x0) {
                psVar17 = &SchemaSymbols::fgELT_ATTRIBUTEGROUP;
                while (sVar1 = *psVar12, sVar1 != 0) {
                  psVar12 = psVar12 + 1;
                  sVar2 = *psVar17;
                  psVar17 = psVar17 + 1;
                  if (sVar1 != sVar2) goto LAB_0032a0a4;
                }
              }
              if (*psVar17 != 0) {
LAB_0032a0a4:
                iVar8 = (*node->_vptr_DOMNode[0x18])(node);
                bVar21 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar8),L"anyAttribute")
                ;
                if (bVar21) {
                  pSVar13 = traverseAnyAttribute(this,(DOMElement *)node);
                  if (pSVar13 != (SchemaAttDef *)0x0) {
                    XercesAttGroupInfo::addAnyAttDef(this->fCurrentAttGroupInfo,pSVar13,false);
                  }
                  pDVar11 = XUtil::getNextSiblingElement(node);
                  if (pDVar11 != (DOMElement *)0x0) {
                    reportSchemaError(this,(DOMElement *)node,
                                      L"http://apache.org/xml/messages/XMLErrors",0x65,pXVar9,
                                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                  }
                }
                else {
                  reportSchemaError(this,(DOMElement *)node,
                                    L"http://apache.org/xml/messages/XMLErrors",0x65,pXVar9,
                                    (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
                }
                break;
              }
            }
            traverseAttributeGroupDecl(this,(DOMElement *)node,typeInfo,false);
          }
        }
        ValueVectorOf<const_xercesc_4_0::DOMElement_*>::removeElementAt
                  (this->fDeclStack,this->fDeclStack->fCurCount - 1);
        pXVar5 = this->fStringPool;
        pRVar6 = this->fAttGroupRegistry;
        uVar7 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5,pXVar9);
        iVar8 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar7);
        RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::put
                  (pRVar6,(void *)CONCAT44(extraout_var_02,iVar8),this_02);
        this->fCurrentAttGroupInfo = pXVar4;
        this_00 = &this->fBuffer;
        pXVar10 = this->fTargetNSURIString;
        (this->fBuffer).fIndex = 0;
        if ((pXVar10 == (XMLCh *)0x0) || (*pXVar10 == L'\0')) {
          XVar18 = 0;
        }
        else {
          XMLBuffer::append(this_00,pXVar10);
          XVar18 = this_00->fIndex;
        }
        if (XVar18 == (this->fBuffer).fCapacity) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar18 = this_00->fIndex;
        }
        (this->fBuffer).fIndex = XVar18 + 1;
        (this->fBuffer).fBuffer[XVar18] = L',';
        XMLBuffer::append(this_00,pXVar9);
        pXVar5 = this->fStringPool;
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        iVar8 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])();
        if ((this->fRedefineComponents !=
             (RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *)0x0) &&
           (pcVar14 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                                (this->fRedefineComponents,&SchemaSymbols::fgELT_ATTRIBUTEGROUP,
                                 iVar8), pcVar14 != (char16_t *)0x0)) {
          this_00->fIndex = 0;
          if ((pXVar9 != (XMLCh *)0x0) && (*pXVar9 != L'\0')) {
            XMLBuffer::append(this_00,pXVar9);
          }
          XMLBuffer::append(this_00,(XMLCh *)SchemaSymbols::fgRedefIdentifier);
          pRVar6 = this->fAttGroupRegistry;
          pXVar9 = (this->fBuffer).fBuffer;
          pXVar9[(this->fBuffer).fIndex] = L'\0';
          uVar15 = (ulong)(ushort)*pXVar9;
          if (uVar15 == 0) {
            uVar15 = 0;
          }
          else {
            XVar19 = pXVar9[1];
            if (XVar19 != L'\0') {
              pXVar10 = pXVar9 + 2;
              do {
                uVar15 = (ulong)(ushort)XVar19 + (uVar15 >> 0x18) + uVar15 * 0x26;
                XVar19 = *pXVar10;
                pXVar10 = pXVar10 + 1;
              } while (XVar19 != L'\0');
            }
            uVar15 = uVar15 % pRVar6->fHashModulus;
          }
          pRVar20 = pRVar6->fBucketList[uVar15];
          if (pRVar20 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0) {
            do {
              bVar21 = StringHasher::equals
                                 ((StringHasher *)&pRVar6->field_0x30,pXVar9,pRVar20->fKey);
              if (bVar21) {
                if (pRVar20->fData != (XercesAttGroupInfo *)0x0) {
                  checkAttDerivationOK(this,elem,pRVar20->fData,this_02);
                }
                break;
              }
              pRVar20 = pRVar20->fNext;
            } while (pRVar20 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0);
          }
        }
        if (annotation != (XSAnnotation *)0x0) {
          SchemaGrammar::putAnnotation(this->fSchemaGrammar,this_02,annotation);
        }
LAB_0032a35a:
        if (this_02 != (XercesAttGroupInfo *)0x0) {
          if (((this_02->fAnyAttributes != (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) &&
              (XVar18 = (this_02->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
                        fCurCount, XVar18 != 0)) &&
             (this_02->fCompleteWildCard == (SchemaAttDef *)0x0)) {
            pSVar13 = (SchemaAttDef *)XMemory::operator_new(0x68,this->fGrammarPoolMemoryManager);
            if (&this_02->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef> ==
                (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
              pSVar16 = (SchemaAttDef *)0x0;
            }
            else {
              pSVar16 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                                  (&this_02->fAnyAttributes->
                                    super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,0);
            }
            SchemaAttDef::SchemaAttDef(pSVar13,pSVar16);
            if (XVar18 != 1) {
              getAt = 1;
              do {
                if (&this_02->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef> ==
                    (BaseRefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
                  pSVar16 = (SchemaAttDef *)0x0;
                }
                else {
                  pSVar16 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                                      (&this_02->fAnyAttributes->
                                        super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,getAt);
                }
                attWildCardIntersection(this,pSVar13,pSVar16);
                getAt = getAt + 1;
              } while (XVar18 != getAt);
            }
            if (this_02->fCompleteWildCard != (SchemaAttDef *)0x0) {
              (*(this_02->fCompleteWildCard->super_XMLAttDef).super_XSerializable.
                _vptr_XSerializable[1])();
            }
            this_02->fCompleteWildCard = pSVar13;
          }
          goto LAB_00329ee4;
        }
      }
      else {
        reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x35,
                          L"attributeGroup",pXVar9,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else if (!bVar22) {
      this_02 = processAttributeGroupRef(this,elem,pXVar10,typeInfo);
      goto LAB_0032a35a;
    }
  }
  else {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x13);
  }
  this_02 = (XercesAttGroupInfo *)0x0;
LAB_00329ee4:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return this_02;
}

Assistant:

XercesAttGroupInfo*
TraverseSchema::traverseAttributeGroupDecl(const DOMElement* const elem,
                                           ComplexTypeInfo* const typeInfo,
                                           const bool topLevel) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    const XMLCh* ref = getElementAttValue(elem, SchemaSymbols::fgATT_REF, DatatypeValidator::QName);
    bool         nameEmpty = (!name || !*name) ? true : false;
    bool         refEmpty = (!ref || !*ref) ? true : false;

    if (nameEmpty && topLevel) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameGlobalElement,
            SchemaSymbols::fgELT_ATTRIBUTEGROUP);
        return 0;
    }

    if (nameEmpty && refEmpty) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNameRefAttGroup);
        return 0;
    }

    // ------------------------------------------------------------------
    // Check attributes
    // ------------------------------------------------------------------
    unsigned short scope = (topLevel) ? GeneralAttributeCheck::E_AttributeGroupGlobal
                                      : GeneralAttributeCheck::E_AttributeGroupRef;
    fAttributeCheck.checkAttributes(elem, scope, this, topLevel, fNonXSAttList);

    // ------------------------------------------------------------------
    // Handle "ref="
    // ------------------------------------------------------------------
    XercesAttGroupInfo* attGroupInfo;
    Janitor<XercesAttGroupInfo> janAttGroupInfo(0);
    if (!topLevel) {

        if (refEmpty) {
            return 0;
        }

        attGroupInfo = processAttributeGroupRef(elem, ref, typeInfo);
    }
    else
    {
        // name must be a valid NCName
        if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                              SchemaSymbols::fgELT_ATTRIBUTEGROUP, name);
            return 0;
        }

        // Check for annotations
        DOMElement* content = checkContent(elem, XUtil::getFirstChildElement(elem), true);
        if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
        {
            fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        }
        Janitor<XSAnnotation> janAnnot(fAnnotation);

        // Process contents of global attributeGroups
        XercesAttGroupInfo* saveAttGroupInfo = fCurrentAttGroupInfo;
        janAttGroupInfo.reset(new (fGrammarPoolMemoryManager) XercesAttGroupInfo(
            fStringPool->addOrFind(name), fTargetNSURI, fGrammarPoolMemoryManager));

        fDeclStack->addElement(elem);
        fCurrentAttGroupInfo = janAttGroupInfo.get();

        for (; content !=0; content = XUtil::getNextSiblingElement(content)) {

            if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ATTRIBUTE)) {
                traverseAttributeDecl(content, typeInfo);
            }
            else if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {
                traverseAttributeGroupDecl(content, typeInfo);
            }
            else {
                break;
            }
        }

        if (content != 0) {

            if (XMLString::equals(content->getLocalName(), SchemaSymbols::fgELT_ANYATTRIBUTE)) {

                SchemaAttDef* anyAtt = traverseAnyAttribute(content);

                if (anyAtt) {
                    fCurrentAttGroupInfo->addAnyAttDef(anyAtt);
                }

                if (XUtil::getNextSiblingElement(content) != 0) {
                    reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AttGroupContentError, name);
                }
            }
            else {
                reportSchemaError(content, XMLUni::fgXMLErrDomain, XMLErrs::AttGroupContentError, name);
            }
        }

        // Pop declaration
        fDeclStack->removeElementAt(fDeclStack->size() - 1);

        fAttGroupRegistry->put((void*) fStringPool->getValueForId(fStringPool->addOrFind(name)), janAttGroupInfo.get());
        // Restore old attGroupInfo
        attGroupInfo = janAttGroupInfo.release();
        fCurrentAttGroupInfo = saveAttGroupInfo;

        // Check Attribute Derivation Restriction OK
        fBuffer.set(fTargetNSURIString);
        fBuffer.append(chComma);
        fBuffer.append(name);

        unsigned int nameIndex = fStringPool->addOrFind(fBuffer.getRawBuffer());

        if (fRedefineComponents && fRedefineComponents->get(SchemaSymbols::fgELT_ATTRIBUTEGROUP, nameIndex)) {

            fBuffer.set(name);
            fBuffer.append(SchemaSymbols::fgRedefIdentifier);
            XercesAttGroupInfo* baseAttGroupInfo = fAttGroupRegistry->get(fBuffer.getRawBuffer());

            if (baseAttGroupInfo)
                checkAttDerivationOK(elem, baseAttGroupInfo, attGroupInfo);
        }

        // Store annotation
        if (!janAnnot.isDataNull())
            fSchemaGrammar->putAnnotation(attGroupInfo, janAnnot.release());
    }

    // calculate complete wildcard if necessary
    if (attGroupInfo)
    {
        XMLSize_t anyAttCount = attGroupInfo->anyAttributeCount();
        if (anyAttCount && !attGroupInfo->getCompleteWildCard())
        {
            SchemaAttDef* attGroupWildCard =  new (fGrammarPoolMemoryManager)
                SchemaAttDef(attGroupInfo->anyAttributeAt(0));

            for (XMLSize_t k= 1; k < anyAttCount; k++)
                attWildCardIntersection(attGroupWildCard, attGroupInfo->anyAttributeAt(k));

            attGroupInfo->setCompleteWildCard(attGroupWildCard);
        }
    }

    return attGroupInfo;
}